

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void api_dynamic_suite::dynamic_ctor_iterator_init(void)

{
  undefined8 local_40;
  undefined4 local_34;
  
  boost::detail::test_impl
            ("!span.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x97,"void api_dynamic_suite::dynamic_ctor_iterator_init()",true);
  boost::detail::test_impl
            ("span.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x98,"void api_dynamic_suite::dynamic_ctor_iterator_init()",true);
  local_40 = 4;
  local_34 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x99,"void api_dynamic_suite::dynamic_ctor_iterator_init()",&local_40,&local_34);
  local_40 = 4;
  local_34 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9a,"void api_dynamic_suite::dynamic_ctor_iterator_init()",&local_40,&local_34);
  return;
}

Assistant:

void dynamic_ctor_iterator_init()
{
    std::array<int, 4> array = { 1, 2, 3, 4 };
    circular_view<int> span(array.begin(), array.end(), array.begin(), array.size());
    BOOST_TEST(!span.empty());
    BOOST_TEST(span.full());
    BOOST_TEST_EQ(span.size(), 4);
    BOOST_TEST_EQ(span.capacity(), 4);
}